

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O2

void anon_unknown.dwarf_8214a::invertM33f(M33f *m,float e)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  M33f ident2;
  M33f ident1;
  M33f inv2;
  M33f inv1;
  
  Imath_3_2::Matrix33<float>::inverse(&inv1,m);
  Imath_3_2::Matrix33<float>::gjInverse(&inv2,m);
  Imath_3_2::Matrix33<float>::operator*(m,&inv1);
  Imath_3_2::Matrix33<float>::operator*(m,&inv2);
  bVar1 = Imath_3_2::Matrix33<float>::equalWithAbsError
                    (&ident1,(Matrix33<float> *)&Imath_3_2::identity33f,e);
  if (bVar1) {
    bVar1 = Imath_3_2::Matrix33<float>::equalWithAbsError
                      (&ident2,(Matrix33<float> *)&Imath_3_2::identity33f,e);
    if (bVar1) {
      return;
    }
    __assertion = "ident2.equalWithAbsError (identity33f, e)";
    __line = 0x33;
  }
  else {
    __assertion = "ident1.equalWithAbsError (identity33f, e)";
    __line = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                ,__line,"void (anonymous namespace)::invertM33f(const M33f &, float)");
}

Assistant:

void
invertM33f (const M33f& m, float e)
{
    M33f inv1   = m.inverse ();
    M33f inv2   = m.gjInverse ();
    M33f ident1 = m * inv1;
    M33f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity33f, e));
    assert (ident2.equalWithAbsError (identity33f, e));
}